

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<sophia_interface*,bool,double,double,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<sophia_interface*,bool,double,double,bool> *this,long call)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  char local_1c [3];
  bool local_19;
  
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x20),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  local_1c[0] = type_caster<bool,_void>::load
                          ((type_caster<bool,_void> *)(this + 0x18),
                           *(PyObject **)(*(long *)(call + 8) + 8),
                           SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  local_1c[1] = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)(this + 0x10),
                           *(PyObject **)(*(long *)(call + 8) + 0x10),
                           SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  local_1c[2] = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)(this + 8),
                           *(PyObject **)(*(long *)(call + 8) + 0x18),
                           SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  local_19 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x20),
                        SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  if (bVar2) {
    lVar3 = 0;
    do {
      bVar2 = lVar3 == 4;
      if (bVar2) {
        return bVar2;
      }
      pcVar1 = local_1c + lVar3;
      lVar3 = lVar3 + 1;
    } while (*pcVar1 != '\0');
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }